

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O0

int main(void)

{
  ostream *this;
  exception *e;
  
  test();
  this = std::operator<<((ostream *)&std::cout,"done");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int
main()
{
    try {
        test();
    } catch (std::exception& e) {
        std::cout << "unexpected exception: " << e.what() << std::endl;
        exit(2);
    }
    std::cout << "done" << std::endl;
    return 0;
}